

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Lms_ManPrepare(Lms_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *p_00;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Wrd_t *pVVar9;
  Vec_Str_t *pVVar10;
  ulong uVar11;
  int Best;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  
  if (p->fLibConstr != 0) {
    __assert_fail("!p->fLibConstr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x184,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruthPo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x185,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  pVVar3 = p->vTtMem;
  iVar12 = pVVar3->nEntries;
  lVar13 = (long)iVar12 + 1;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar16 = (int)lVar13;
  iVar6 = 0x10;
  if (0xe < (ulong)(long)iVar12) {
    iVar6 = iVar16;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar16;
LAB_002f764b:
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar6 << 2);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = iVar16;
    if (piVar8 == (int *)0x0) goto LAB_002f764b;
    memset(piVar8,0xff,lVar13 * 4);
  }
  p->vTruthPo = pVVar7;
  pVVar4 = p->vTruthIds;
  uVar1 = pVVar4->nSize;
  uVar11 = (ulong)uVar1;
  if (uVar11 == 0) {
    uVar2 = pVVar3->nEntries;
    if ((int)uVar2 < 1) goto LAB_002f7855;
  }
  else {
    piVar5 = pVVar4->pArray;
    iVar12 = *piVar5;
    if ((int)uVar1 < 2) {
      if (iVar12 < 0) goto LAB_002f78d1;
    }
    else {
      uVar14 = 1;
      iVar6 = iVar12;
      do {
        iVar16 = piVar5[uVar14];
        if (iVar6 < piVar5[uVar14]) {
          iVar16 = iVar6;
        }
        iVar6 = iVar16;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      if (iVar6 < 0) {
LAB_002f78d1:
        __assert_fail("Vec_IntFindMin(p->vTruthIds) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x187,"void Lms_ManPrepare(Lms_Man_t *)");
      }
      uVar14 = 1;
      do {
        if (iVar12 <= piVar5[uVar14]) {
          iVar12 = piVar5[uVar14];
        }
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
    uVar2 = pVVar3->nEntries;
    if ((int)uVar2 <= iVar12) {
LAB_002f7855:
      __assert_fail("Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x188,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (0 < (int)uVar1) {
      piVar5 = pVVar4->pArray;
      lVar13 = 0;
      do {
        lVar15 = (long)piVar5[lVar13];
        if ((lVar15 < 0) || (pVVar7->nSize <= piVar5[lVar13])) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (piVar8[lVar15] == -1) {
          piVar8[lVar15] = (int)lVar13;
          uVar11 = (ulong)(uint)pVVar4->nSize;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)uVar11);
      uVar2 = pVVar3->nEntries;
    }
    if ((int)uVar2 < 0) goto LAB_002f77f8;
  }
  if ((int)uVar2 < pVVar7->nSize) {
    p_00 = p->pGia;
    piVar8[uVar2] = p_00->vCos->nSize;
    if (p->vDelays != (Vec_Wrd_t *)0x0) {
      __assert_fail("p->vDelays == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x18e,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vAreas != (Vec_Str_t *)0x0) {
      __assert_fail("p->vAreas == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,399,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vFreqs != (Vec_Int_t *)0x0) {
      __assert_fail("p->vFreqs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,400,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    pVVar9 = Lms_GiaDelays(p_00);
    p->vDelays = pVVar9;
    pVVar10 = Lms_GiaAreas(p->pGia);
    p->vAreas = pVVar10;
    iVar12 = p->pGia->vCos->nSize;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < iVar12 - 1U) {
      iVar6 = iVar12;
    }
    pVVar7->nCap = iVar6;
    if (iVar6 == 0) {
      pVVar7->pArray = (int *)0x0;
      pVVar7->nSize = iVar12;
    }
    else {
      piVar8 = (int *)malloc((long)iVar6 << 2);
      pVVar7->pArray = piVar8;
      pVVar7->nSize = iVar12;
      if (piVar8 != (int *)0x0) {
        memset(piVar8,0,(long)iVar12 << 2);
      }
    }
    p->vFreqs = pVVar7;
    return;
  }
LAB_002f77f8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Lms_ManPrepare( Lms_Man_t * p )
{
    // compute the first PO for each semi-canonical form
    int i, Entry;
    assert( !p->fLibConstr );
    assert( p->vTruthPo == NULL );
    p->vTruthPo = Vec_IntStartFull( Vec_MemEntryNum(p->vTtMem)+1 );
    assert( Vec_IntFindMin(p->vTruthIds) >= 0 );
    assert( Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem) );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Vec_IntEntry(p->vTruthPo, Entry) == -1 )
            Vec_IntWriteEntry( p->vTruthPo, Entry, i );
    Vec_IntWriteEntry( p->vTruthPo, Vec_MemEntryNum(p->vTtMem), Gia_ManCoNum(p->pGia) );
    // compute delay/area and init frequency
    assert( p->vDelays == NULL );
    assert( p->vAreas == NULL );
    assert( p->vFreqs == NULL );
    p->vDelays = Lms_GiaDelays( p->pGia );
    p->vAreas  = Lms_GiaAreas( p->pGia );
    p->vFreqs  = Vec_IntStart( Gia_ManCoNum(p->pGia) );
}